

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnEventSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index event_index)

{
  string_view name_00;
  bool bVar1;
  reference this_00;
  undefined1 local_78 [40];
  Index local_50;
  BinaryReaderObjdumpPrepass *local_48;
  char *local_40;
  Index local_34;
  uint32_t local_30;
  Index event_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdumpPrepass *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderObjdumpPrepass *)name.data_;
  local_34 = event_index;
  local_30 = flags;
  event_index_local = index;
  _flags_local = this;
  bVar1 = string_view::empty((string_view *)&this_local);
  if (!bVar1) {
    local_48 = this_local;
    local_40 = name_local.data_;
    name_00.size_ = (size_type)name_local.data_;
    name_00.data_ = (char *)this_local;
    SetEventName(this,local_34,name_00);
  }
  local_78._0_4_ = Event;
  string_view::to_string_abi_cxx11_((string_view *)(local_78 + 8));
  local_50 = local_34;
  this_00 = std::vector<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>::operator[]
                      (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab,
                       (ulong)event_index_local);
  ObjdumpSymbol::operator=(this_00,(ObjdumpSymbol *)local_78);
  ObjdumpSymbol::~ObjdumpSymbol((ObjdumpSymbol *)local_78);
  Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result OnEventSymbol(Index index,
                        uint32_t flags,
                        string_view name,
                        Index event_index) override {
    if (!name.empty()) {
      SetEventName(event_index, name);
    }
    objdump_state_->symtab[index] = {SymbolType::Event, name.to_string(),
                                     event_index};
    return Result::Ok;
  }